

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O0

string * __thiscall
license::CryptoHelperLinux::Opensslb64Encode_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this,size_t slen,uchar *signature)

{
  BIO_METHOD *pBVar1;
  ulong uStack_48;
  int sz;
  char *charBuf;
  BIO *bio1;
  BIO *b64;
  BIO *mem_bio;
  uchar *signature_local;
  size_t slen_local;
  CryptoHelperLinux *this_local;
  string *signatureStr;
  
  mem_bio = (BIO *)signature;
  signature_local = (uchar *)slen;
  slen_local = (size_t)this;
  this_local = (CryptoHelperLinux *)__return_storage_ptr__;
  pBVar1 = BIO_s_mem();
  b64 = (BIO *)BIO_new(pBVar1);
  pBVar1 = BIO_f_base64();
  bio1 = (BIO *)BIO_new(pBVar1);
  charBuf = (char *)BIO_push((BIO *)bio1,(BIO *)b64);
  BIO_set_flags((BIO *)charBuf,0x100);
  BIO_write((BIO *)charBuf,mem_bio,(int)signature_local);
  BIO_ctrl((BIO *)charBuf,0xb,0,(void *)0x0);
  BIO_ctrl((BIO *)b64,3,0,&stack0xffffffffffffffb8);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::assign((char *)__return_storage_ptr__,uStack_48);
  BIO_free_all((BIO *)charBuf);
  return __return_storage_ptr__;
}

Assistant:

const string CryptoHelperLinux::Opensslb64Encode(size_t slen,
		unsigned char* signature) const {
	/*
	 FILE*  stream = fmemopen(*buffer, encodedSize+1, "w");
	 */
	//bio = BIO_new_fp(stdout, BIO_NOCLOSE);
	/*int encodedSize = 4 * ceil(slen / 3);
	 char* buffer = (char*) (malloc(encodedSize + 1));
	 memset(buffer,0,encodedSize+1);*/
	BIO* mem_bio = BIO_new(BIO_s_mem());
	BIO* b64 = BIO_new(BIO_f_base64());
	BIO* bio1 = BIO_push(b64, mem_bio);
	BIO_set_flags(bio1, BIO_FLAGS_BASE64_NO_NL);
	BIO_write(bio1, signature, slen);
	BIO_flush(bio1);
	char* charBuf;
	int sz = BIO_get_mem_data(mem_bio, &charBuf);
	string signatureStr;
	signatureStr.assign(charBuf, sz);
	BIO_free_all(bio1);
	return signatureStr;
}